

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O3

NBestEncodeResult * __thiscall
sentencepiece::unigram::Model::SampleEncodeAndScore
          (NBestEncodeResult *__return_storage_ptr__,Model *this,string_view normalized,
          float inv_theta,int samples,bool wor,bool include_best)

{
  void *pvVar1;
  Node *__args;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> *__args_00;
  pointer ppVar3;
  pointer ppNVar4;
  size_t sVar5;
  pointer ppVar6;
  uint uVar7;
  int iVar8;
  __normal_iterator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_*,_std::vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>_>
  _Var9;
  ostream *poVar10;
  NBestEncodeResult *pNVar11;
  double dVar12;
  pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>
  *it;
  long lVar13;
  pointer ppVar14;
  char *pcVar15;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  *__range4;
  pointer ppVar16;
  long lVar17;
  _func_int **pp_Var18;
  ulong uVar19;
  pointer ppNVar20;
  float fVar21;
  undefined1 auVar22 [16];
  string_view sentence;
  EncodeResult result;
  vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
  nbest_paths;
  vector<float,_std::allocator<float>_> alpha;
  LatticePathWithScore best_path;
  Lattice lattice;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  local_218;
  double local_1f8;
  NBestEncodeResult *local_1f0;
  float local_1e4;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  local_1e0;
  NBestEncodeResult local_1c8;
  Model *local_1a8;
  double local_190;
  float local_184;
  vector<float,_std::allocator<float>_> local_180;
  Lattice local_168;
  Lattice local_c8;
  
  dVar12 = (double)normalized._M_len;
  local_1f0 = __return_storage_ptr__;
  (*(this->super_ModelInterface)._vptr_ModelInterface[2])(&local_c8);
  if (local_c8._vptr_Lattice != (_func_int **)0x0) {
    util::Status::~Status((Status *)&local_c8);
LAB_001f4d4d:
    (local_1f0->
    super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_1f0->
    super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_1f0->
    super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return local_1f0;
  }
  util::Status::~Status((Status *)&local_c8);
  if (dVar12 == 0.0) goto LAB_001f4d4d;
  local_1c8.
  super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Lattice::Lattice(&local_c8);
  Lattice::SetSentence(&local_c8,normalized);
  PopulateNodes(this,&local_c8);
  Lattice::ForwardAlgorithm(&local_180,&local_c8,inv_theta);
  uVar7 = (int)((ulong)((long)local_c8.surface_.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_c8.surface_.
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3) - 1;
  uVar19 = 0;
  if (0 < (int)uVar7) {
    uVar19 = (ulong)uVar7;
  }
  local_1e4 = local_180.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start
              [(*local_c8.begin_nodes_.
                 super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar19].
                 super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_start)->node_id];
  if (include_best) {
    if (!wor) {
      iVar8 = logging::GetMinLogLevel();
      pNVar11 = local_1f0;
      if (iVar8 < 3) {
        local_168._vptr_Lattice =
             (_func_int **)((ulong)local_168._vptr_Lattice & 0xffffffffffffff00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unigram_model.cc",0x10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x2f6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"LOG(",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ERROR",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"include_best not supported for wor false",0x28);
        error::Die::~Die((Die *)&local_168);
        pNVar11 = local_1f0;
      }
      goto LAB_001f54a7;
    }
    local_218.
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_218.
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f8 = dVar12;
    local_1a8 = this;
    Lattice::Viterbi((LatticePathWithScore *)&local_168,&local_c8);
    sVar5 = local_168.sentence_._M_len;
    if (local_168._vptr_Lattice != (_func_int **)local_168.sentence_._M_len) {
      pp_Var18 = local_168._vptr_Lattice;
      do {
        std::
        vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
        ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&,int_const&>
                  ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
                    *)&local_218,(basic_string_view<char,_std::char_traits<char>_> *)*pp_Var18,
                   (int *)((long)&((basic_string_view<char,_std::char_traits<char>_> *)*pp_Var18)[1]
                                  ._M_str + 4));
        pp_Var18 = pp_Var18 + 1;
      } while (pp_Var18 != (_func_int **)sVar5);
    }
    local_1e0.
    super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::
    vector<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>,std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>>>
    ::
    emplace_back<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>&,double>
              ((vector<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>,std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>>>
                *)&local_1c8,&local_218,(double *)&local_1e0);
    dVar12 = local_1f8;
    if (local_168._vptr_Lattice != (_func_int **)0x0) {
      operator_delete(local_168._vptr_Lattice,
                      (long)local_168.sentence_._M_str - (long)local_168._vptr_Lattice);
    }
    this = local_1a8;
    if (local_218.
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_218.
                      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_218.
                            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_218.
                            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (wor) {
    Lattice::NBest((vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
                    *)&local_218,&local_c8,(long)(samples + 1),true,inv_theta);
    if (include_best) {
      std::
      vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
      ::vector((vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                *)&local_1e0,
               (long)local_218.
                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_218.
                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_168);
      if (local_218.
          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_218.
          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar13 = 0;
        lVar17 = 0;
        uVar19 = 0;
        do {
          std::
          vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
          ::operator=((vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                       *)((long)local_1e0.
                                super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar17),
                      (vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                       *)((long)&((local_218.
                                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->first)._M_len +
                         lVar13));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x18;
          lVar13 = lVar13 + 0x20;
        } while (uVar19 < (ulong)((long)local_218.
                                        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_218.
                                        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      Lattice::Viterbi((LatticePathWithScore *)&local_168,&local_c8);
      _Var9 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::vector<sentencepiece::unigram::Lattice::Node*,std::allocator<sentencepiece::unigram::Lattice::Node*>>*,std::vector<std::vector<sentencepiece::unigram::Lattice::Node*,std::allocator<sentencepiece::unigram::Lattice::Node*>>,std::allocator<std::vector<sentencepiece::unigram::Lattice::Node*,std::allocator<sentencepiece::unigram::Lattice::Node*>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<sentencepiece::unigram::Lattice::Node*,std::allocator<sentencepiece::unigram::Lattice::Node*>>const>>
                        (local_1e0.
                         super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_1e0.
                         super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_168);
      lVar13 = (long)((int)((ulong)((long)_Var9._M_current -
                                   (long)local_1e0.
                                         super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x55555555);
      if (lVar13 == (long)local_218.
                          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_218.
                          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) {
        pvVar1 = *(void **)&local_218.
                            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-2].second;
        ppVar6 = (pointer)&local_218.
                           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-2].second;
        if (pvVar1 != (void *)0x0) {
          ppVar6 = local_218.
                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
          local_218.
          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)&local_218.
                         super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-2].second;
          operator_delete(pvVar1,(long)(ppVar6->first)._M_str - (long)pvVar1);
          ppVar6 = local_218.
                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      else {
        std::
        vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
        ::_M_erase((vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
                    *)&local_218,
                   (pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>
                    *)((long)local_218.
                             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar13 * 0x20));
        ppVar6 = local_218.
                 super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_218.
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
      if (local_168._vptr_Lattice != (_func_int **)0x0) {
        operator_delete(local_168._vptr_Lattice,
                        (long)local_168.sentence_._M_str - (long)local_168._vptr_Lattice);
      }
      std::
      vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
      ::~vector((vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                 *)&local_1e0);
    }
    local_190 = (double)(float)local_218.
                               super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1].second;
    pvVar1 = *(void **)&local_218.
                        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-2].second;
    ppVar6 = (pointer)&local_218.
                       super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-2].second;
    if (pvVar1 != (void *)0x0) {
      ppVar6 = local_218.
               super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      local_218.
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)&local_218.
                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-2].second;
      operator_delete(pvVar1,(long)(ppVar6->first)._M_str - (long)pvVar1);
      ppVar6 = local_218.
               super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    local_218.
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
    ppVar6 = local_218.
             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar14 = local_1c8.
              super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = local_1c8.
             super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_218.
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_218.
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar16 = local_218.
                super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_168._vptr_Lattice = (_func_int **)0x0;
        local_168.sentence_._M_len = 0;
        local_168.sentence_._M_str = (char *)0x0;
        pcVar2 = (ppVar16->first)._M_str;
        fVar21 = 0.0;
        for (pcVar15 = (char *)(ppVar16->first)._M_len; pcVar15 != pcVar2; pcVar15 = pcVar15 + 8) {
          local_1f8 = (double)CONCAT44(local_1f8._4_4_,fVar21);
          __args_00 = *(basic_string_view<char,_std::char_traits<char>_> **)pcVar15;
          local_1a8 = (Model *)CONCAT44(local_1a8._4_4_,(int)__args_00[2]._M_len);
          std::
          vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
          ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&,int_const&>
                    ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
                      *)&local_168,__args_00,(int *)((long)&__args_00[1]._M_str + 4));
          fVar21 = local_1f8._0_4_ + local_1a8._0_4_ * inv_theta;
        }
        local_1e0.
        super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_1e0.
                               super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar21 - local_1e4);
        std::
        vector<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>,std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>>>
        ::
        emplace_back<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>&,float>
                  ((vector<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>,std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>>>
                    *)&local_1c8,
                   (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                    *)&local_168,(float *)&local_1e0);
        if (local_168._vptr_Lattice != (_func_int **)0x0) {
          operator_delete(local_168._vptr_Lattice,
                          (long)local_168.sentence_._M_str - (long)local_168._vptr_Lattice);
        }
        ppVar16 = (pointer)&ppVar16[1].first._M_str;
        ppVar14 = local_1c8.
                  super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar3 = local_1c8.
                 super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while (ppVar16 != ppVar6);
    }
    for (; ppVar14 != ppVar3; ppVar14 = ppVar14 + 1) {
      fVar21 = ppVar14->second;
      if ((fVar21 != 0.0) || (NAN(fVar21))) {
        local_1f8 = (double)fVar21 - local_190;
        dVar12 = exp(local_1f8);
        if (local_1f8 <= -10.0) {
          local_1f8 = local_1f8 + dVar12 * -0.5;
          local_1a8 = (Model *)(dVar12 * dVar12);
          dVar12 = pow(dVar12,4.0);
          auVar22._8_8_ = dVar12;
          auVar22._0_8_ = local_1a8;
          auVar22 = divpd(auVar22,_DAT_002532f0);
          dVar12 = (local_1f8 + auVar22._0_8_) - auVar22._8_8_;
        }
        else {
          dVar12 = expm1((double)((ulong)dVar12 ^ (ulong)DAT_00253300));
          dVar12 = log(-dVar12);
        }
        ppVar14->second = (float)dVar12;
      }
    }
    std::
    vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
    ::~vector((vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
               *)&local_218);
  }
  else {
    local_190 = (double)(long)samples;
    if ((ulong)((long)local_1c8.
                      super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1c8.
                      super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < (ulong)local_190) {
      local_1a8 = this;
      do {
        Lattice::Lattice(&local_168);
        sentence._M_str = normalized._M_str;
        sentence._M_len = (size_t)dVar12;
        Lattice::SetSentence(&local_168,sentence);
        PopulateNodes(this,&local_168);
        local_218.
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_218.
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_218.
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Lattice::Sample(&local_1e0,&local_168,inv_theta);
        ppNVar4 = local_1e0.
                  super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        fVar21 = 0.0;
        for (ppNVar20 = local_1e0.
                        super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppNVar20 != ppNVar4;
            ppNVar20 = ppNVar20 + 1) {
          local_1f8 = (double)CONCAT44(local_1f8._4_4_,fVar21);
          __args = *ppNVar20;
          std::
          vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
          ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&,int_const&>
                    ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
                      *)&local_218,&__args->piece,&__args->id);
          fVar21 = local_1f8._0_4_ + __args->score * inv_theta;
        }
        local_184 = fVar21 - local_1e4;
        std::
        vector<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>,std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>>>
        ::
        emplace_back<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>&,float>
                  ((vector<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>,std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>>>
                    *)&local_1c8,&local_218,&local_184);
        if (local_1e0.
            super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1e0.
                          super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1e0.
                                super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e0.
                                super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        this = local_1a8;
        if (local_218.
            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_218.
                          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_218.
                                super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_218.
                                super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        Lattice::~Lattice(&local_168);
      } while ((ulong)((long)local_1c8.
                             super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_1c8.
                             super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5) < (ulong)local_190);
    }
  }
  (local_1f0->
  super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_1c8.
       super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (local_1f0->
  super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_1c8.
       super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (local_1f0->
  super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1c8.
       super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pNVar11 = &local_1c8;
LAB_001f54a7:
  (pNVar11->
  super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar11->
  super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar11->
  super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_180.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_180.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_180.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Lattice::~Lattice(&local_c8);
  std::
  vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  ::~vector(&local_1c8);
  return local_1f0;
}

Assistant:

NBestEncodeResult Model::SampleEncodeAndScore(absl::string_view normalized,
                                              float inv_theta, int samples,
                                              bool wor,
                                              bool include_best) const {
  if (!status().ok() || normalized.empty()) {
    return {};
  }
  NBestEncodeResult results;
  Lattice lattice;
  lattice.SetSentence(normalized);
  PopulateNodes(&lattice);

  const std::vector<float> alpha = lattice.ForwardAlgorithm(inv_theta);
  const float marginal = alpha[lattice.eos_node()->node_id];

  if (include_best) {
    if (!wor) {
      LOG(ERROR) << "include_best not supported for wor false";
      return {};
    }
    EncodeResult result;
    const auto best_path = lattice.Viterbi();
    for (const auto *node : best_path.first) {
      result.emplace_back(node->piece, node->id);
    }

    // Inclusion probability if we always include the best is 1.
    results.emplace_back(result, 0.0);
  }

  if (wor) {
    // Draw k+1 samples as we need perturbed score of k+1th element
    auto nbest_samples = lattice.NBest(samples + 1, true, inv_theta);

    if (include_best) {
      std::vector<std::vector<Lattice::Node *>> nbest_paths(
          nbest_samples.size());
      for (int i = 0; i < nbest_samples.size(); i++) {
        nbest_paths[i] = nbest_samples[i].first;
      }
      // Remove the best result from the samples if necessary
      const auto best_path = lattice.Viterbi();

      const int index_of_best =
          (std::find(nbest_paths.begin(), nbest_paths.end(), best_path.first) -
           nbest_paths.begin());

      if (index_of_best != nbest_samples.size()) {
        nbest_samples.erase(nbest_samples.begin() + index_of_best);
      } else {
        nbest_samples.pop_back();
      }
    }
    // We use the perturbed score of the k+1th element to calculate the
    // inclusion probability.
    const double kappa = static_cast<double>(nbest_samples.back().second);
    // Discard the last sample
    nbest_samples.pop_back();
    for (const auto &nbest : nbest_samples) {
      EncodeResult result;
      float score = 0.0;

      for (const auto *node : nbest.first) {
        score += (inv_theta * node->score);
        result.emplace_back(node->piece, node->id);
      }

      results.emplace_back(result, score - marginal);
    }

    // Now calculate the inclusion probability
    for (auto &it : results) {
      // Only modify non best sample inclusion probabilities.
      if (it.second != 0.0) {
        const double x = it.second - kappa;
        const double y = std::exp(x);
        double inclusion_prob;
        if (x <= -10) {
          // Series expansion of the log Gumbel survival function up to eps.
          inclusion_prob =
              x - (y / 2) + (std::pow(y, 2) / 24) - std::pow(y, 4) / 2880;
        } else {
          inclusion_prob = std::log(-std::expm1(-y));
        }
        it.second = static_cast<float>(inclusion_prob);
      }
    }
  } else {
    while (results.size() < samples) {
      Lattice lattice;
      lattice.SetSentence(normalized);
      PopulateNodes(&lattice);

      float score = 0.0;
      EncodeResult result;
      const std::vector<Lattice::Node *> sample = lattice.Sample(inv_theta);
      for (const auto *node : sample) {
        result.emplace_back(node->piece, node->id);
        score += (inv_theta * node->score);
      }
      results.emplace_back(result, score - marginal);
    }
  }

  return results;
}